

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall gvr::Model::setOriginToPLY(Model *this,PLYWriter *ply)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ostream *poVar10;
  basic_ostream<char,_std::char_traits<char>_> *out_00;
  ostringstream out2;
  ostringstream out;
  string local_328;
  string local_308 [3];
  ios_base local_298 [264];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"Origin ",7);
  poVar10 = std::ostream::_M_insert<double>((this->origin).v[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  poVar10 = std::ostream::_M_insert<double>((this->origin).v[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  std::ostream::_M_insert<double>((this->origin).v[2]);
  std::__cxx11::stringbuf::str();
  PLYWriter::addComment(ply,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0]._M_dataplus._M_p != &local_308[0].field_2) {
    operator_delete(local_308[0]._M_dataplus._M_p);
  }
  dVar1 = (this->Rc).v[1][1];
  dVar2 = (this->Rc).v[0][0];
  dVar3 = (this->Rc).v[0][1];
  dVar4 = (this->Rc).v[2][2];
  dVar5 = (this->Rc).v[1][0];
  dVar6 = (this->Rc).v[2][1];
  dVar7 = (this->Rc).v[2][0];
  dVar8 = (this->Rc).v[1][2];
  dVar9 = (this->Rc).v[0][2];
  if (ABS(((((dVar7 * dVar3 * dVar8 + dVar2 * dVar1 * dVar4 + dVar5 * dVar6 * dVar9) -
            dVar1 * dVar9 * dVar7) - dVar6 * dVar8 * dVar2) - dVar3 * dVar4 * dVar5) + -1.0) < 1e-06
     ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_308,"Camera ",7);
    out_00 = gmath::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_308,&this->Rc);
    std::__ostream_insert<char,std::char_traits<char>>(out_00," ",1);
    gmath::operator<<(out_00,&this->Tc);
    std::__cxx11::stringbuf::str();
    PLYWriter::addComment(ply,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    std::ios_base::~ios_base(local_298);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void Model::setOriginToPLY(PLYWriter &ply) const
{
  std::ostringstream out;

  out.precision(16);
  out << "Origin " << origin[0] << " " << origin[1] << " " << origin[2];
  ply.addComment(out.str());

  if (std::abs(det(Rc)-1) < 1e-6)
  {
    std::ostringstream out2;

    out2 << "Camera " << Rc << " " << Tc;
    ply.addComment(out2.str());
  }
}